

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes LookInStream_Read2(ILookInStream *stream,void *buf,size_t size,SRes errorType)

{
  int iVar1;
  size_t sStack_38;
  int __result__;
  size_t processed;
  size_t sStack_28;
  SRes errorType_local;
  size_t size_local;
  void *buf_local;
  ILookInStream *stream_local;
  
  processed._4_4_ = errorType;
  sStack_28 = size;
  size_local = (size_t)buf;
  buf_local = stream;
  while( true ) {
    if (sStack_28 == 0) {
      return 0;
    }
    sStack_38 = sStack_28;
    iVar1 = (**(code **)((long)buf_local + 0x10))(buf_local,size_local,&stack0xffffffffffffffc8);
    if (iVar1 != 0) break;
    if (sStack_38 == 0) {
      return processed._4_4_;
    }
    size_local = size_local + sStack_38;
    sStack_28 = sStack_28 - sStack_38;
  }
  return iVar1;
}

Assistant:

static SRes LookInStream_Read2(ILookInStream *stream, void *buf, size_t size, SRes errorType)
{
  while (size != 0)
  {
    size_t processed = size;
    RINOK(stream->Read(stream, buf, &processed));
    if (processed == 0)
      return errorType;
    buf = (void *)((Byte *)buf + processed);
    size -= processed;
  }
  return SZ_OK;
}